

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

void P_DaggerAlert(AActor *target,AActor *emitter)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  sector_t *psVar4;
  bool bVar5;
  AActor *pAVar6;
  FState *newstate;
  AActor **ppAVar7;
  FSoundID local_3c;
  FName local_38;
  FName local_34;
  
  psVar4 = emitter->Sector;
  pAVar6 = GC::ReadBarrier<AActor>((AActor **)&emitter->LastHeard);
  if ((((pAVar6 == (AActor *)0x0) && (0 < emitter->health)) &&
      (((emitter->flags3).Value & 0x2000) != 0)) &&
     (uVar2 = (emitter->flags4).Value, -1 < (short)uVar2)) {
    (emitter->flags4).Value = uVar2 | 0x8000;
    (emitter->target).field_0.p = target;
    local_34.Index = 0x88;
    local_38.Index = 0xbe;
    newstate = AActor::FindState(emitter,&local_34,&local_38,false);
    if (newstate != (FState *)0x0) {
      AActor::SetState(emitter,newstate,false);
    }
    ppAVar7 = &psVar4->thinglist;
    while (pAVar6 = *ppAVar7, pAVar6 != (AActor *)0x0) {
      if (((pAVar6 != target && pAVar6 != emitter) && (0 < pAVar6->health)) &&
         (((pAVar6->flags4).Value & 0xc000) == 0x4000)) {
        bVar5 = P_CheckSight(pAVar6,target,0);
        if (!bVar5) {
          bVar5 = P_CheckSight(pAVar6,emitter,0);
          if (!bVar5) goto LAB_003fb120;
        }
        (pAVar6->target).field_0.p = target;
        iVar3 = (pAVar6->SeeSound).super_FSoundID.ID;
        if (iVar3 != 0) {
          local_3c.ID = iVar3;
          S_Sound(pAVar6,2,&local_3c,1.0,1.0);
        }
        AActor::SetState(pAVar6,pAVar6->SeeState,false);
        pbVar1 = (byte *)((long)&(pAVar6->flags4).Value + 1);
        *pbVar1 = *pbVar1 | 0x80;
      }
LAB_003fb120:
      ppAVar7 = &pAVar6->snext;
    }
  }
  return;
}

Assistant:

void P_DaggerAlert(AActor *target, AActor *emitter)
{
	AActor *looker;
	sector_t *sec = emitter->Sector;

	if (emitter->LastHeard != NULL)
		return;
	if (emitter->health <= 0)
		return;
	if (!(emitter->flags3 & MF3_ISMONSTER))
		return;
	if (emitter->flags4 & MF4_INCOMBAT)
		return;
	emitter->flags4 |= MF4_INCOMBAT;

	emitter->target = target;
	FState *painstate = emitter->FindState(NAME_Pain, NAME_Dagger);
	if (painstate != NULL)
	{
		emitter->SetState(painstate);
	}

	for (looker = sec->thinglist; looker != NULL; looker = looker->snext)
	{
		if (looker == emitter || looker == target)
			continue;

		if (looker->health <= 0)
			continue;

		if (!(looker->flags4 & MF4_SEESDAGGERS))
			continue;

		if (!(looker->flags4 & MF4_INCOMBAT))
		{
			if (!P_CheckSight(looker, target) && !P_CheckSight(looker, emitter))
				continue;

			looker->target = target;
			if (looker->SeeSound)
			{
				S_Sound(looker, CHAN_VOICE, looker->SeeSound, 1, ATTN_NORM);
			}
			looker->SetState(looker->SeeState);
			looker->flags4 |= MF4_INCOMBAT;
		}
	}
}